

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

bool __thiscall
Lib::FlatteningIterator<Kernel::LookaheadLiteralSelector::GenIteratorIterator>::hasNext
          (FlatteningIterator<Kernel::LookaheadLiteralSelector::GenIteratorIterator> *this)

{
  OptionBase<Lib::VirtualIterator<std::tuple<>_>_> *this_00;
  char cVar1;
  bool bVar2;
  undefined1 local_58 [24];
  VirtualIterator<std::tuple<>_> VStack_40;
  
  this_00 = (OptionBase<Lib::VirtualIterator<std::tuple<>_>_> *)(local_58 + 0x10);
  while( true ) {
    bVar2 = (this->_current).super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>._isSome;
    if (bVar2 != true) {
      return bVar2;
    }
    cVar1 = (**(code **)(*(long *)(this->_current).
                                  super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>._elem._elem
                        + 0x10))();
    if (cVar1 != '\0') break;
    bVar2 = Kernel::LookaheadLiteralSelector::GenIteratorIterator::hasNext(&this->_master);
    if (bVar2) {
      Kernel::LookaheadLiteralSelector::GenIteratorIterator::next((GenIteratorIterator *)local_58);
      local_58._8_8_ = local_58._0_8_;
      if ((IteratorCore<std::tuple<>_> *)local_58._0_8_ != (IteratorCore<std::tuple<>_> *)0x0) {
        *(uint *)(local_58._0_8_ + 8) = *(uint *)(local_58._0_8_ + 8) + 1;
      }
      OptionBase<Lib::VirtualIterator<std::tuple<>_>_>::OptionBase
                (this_00,(VirtualIterator<std::tuple<>_> *)(local_58 + 8));
    }
    else {
      local_58._16_8_ = 0;
      VStack_40._core = (IteratorCore<std::tuple<>_> *)0x0;
    }
    OptionBase<Lib::VirtualIterator<std::tuple<>_>_>::operator=
              (&(this->_current).super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>,this_00);
    OptionBase<Lib::VirtualIterator<std::tuple<>_>_>::~OptionBase(this_00);
    if (bVar2) {
      VirtualIterator<std::tuple<>_>::~VirtualIterator
                ((VirtualIterator<std::tuple<>_> *)(local_58 + 8));
      VirtualIterator<std::tuple<>_>::~VirtualIterator((VirtualIterator<std::tuple<>_> *)local_58);
    }
  }
  return true;
}

Assistant:

bool hasNext()
  {
    while (_current.isSome()) {
      if (_current->hasNext()) {
        return true;
      } else {
        _current = _master.hasNext() 
          ? Option<Inner>(move_if_value<Inner>(_master.next())) 
          : Option<Inner>();
      }
    }
    return false;
  }